

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

bool __thiscall ON_Font::SetAppleWeightOfFont(ON_Font *this,int apple_weight_of_font)

{
  undefined8 apple_font_weight_trait_00;
  Weight font_weight_00;
  bool bVar1;
  undefined1 local_28 [16];
  double apple_font_weight_trait;
  Weight font_weight;
  ON_Font *pOStack_10;
  int apple_weight_of_font_local;
  ON_Font *this_local;
  
  apple_font_weight_trait._4_4_ = apple_weight_of_font;
  pOStack_10 = this;
  apple_font_weight_trait._3_1_ = WeightFromAppleWeightOfFont(apple_weight_of_font);
  local_28._8_8_ = AppleFontWeightTraitFromWeight(apple_font_weight_trait._3_1_);
  font_weight_00 = apple_font_weight_trait._3_1_;
  if ((-1 < apple_font_weight_trait._4_4_) && (apple_font_weight_trait._4_4_ < 10)) {
    local_28._8_8_ = (1.0 - (double)apple_font_weight_trait._4_4_) / 7.5;
    if (-1.0 <= (double)local_28._8_8_) {
      if (1.0 < (double)local_28._8_8_) {
        local_28._8_8_ = 1.0;
      }
    }
    else {
      local_28._8_8_ = -1.0;
    }
  }
  apple_font_weight_trait_00 = local_28._8_8_;
  PostScriptName((ON_Font *)local_28);
  bVar1 = ON_wString::IsEmpty((ON_wString *)local_28);
  bVar1 = Internal_SetFontWeightTrio
                    (this,font_weight_00,-1,(double)apple_font_weight_trait_00,bVar1);
  ON_wString::~ON_wString((ON_wString *)local_28);
  return bVar1;
}

Assistant:

bool ON_Font::SetAppleWeightOfFont(
  int apple_weight_of_font
)
{
  const ON_Font::Weight font_weight = ON_Font::WeightFromAppleWeightOfFont(apple_weight_of_font);
  double apple_font_weight_trait = ON_Font::AppleFontWeightTraitFromWeight(font_weight);
  if (0 <= apple_weight_of_font && apple_weight_of_font <= 9)
  {
    apple_font_weight_trait = (1.0 - apple_weight_of_font) / 7.5;
    if (apple_font_weight_trait < -1.0)
      apple_font_weight_trait = -1.0;
    else if (apple_font_weight_trait > 1.0)
      apple_font_weight_trait = 1.0;    
  }
  return Internal_SetFontWeightTrio(
    font_weight, 
    -1, 
    apple_font_weight_trait,
    PostScriptName().IsEmpty()
  );
}